

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O3

Real __thiscall
amrex::MultiFab::norm0(MultiFab *this,iMultiFab *mask,int comp,int nghost,bool local)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  MFIter mfi;
  double local_170;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)this,true);
  local_170 = 0.0;
  if (local_90.currentIndex < local_90.endIndex) {
    local_170 = 0.0;
    do {
      MFIter::growntilebox(&local_12c,&local_90,nghost);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&this->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_d0,&mask->super_FabArray<amrex::IArrayBox>,&local_90);
      lVar1 = (long)local_12c.smallend.vect[2];
      if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
        lVar2 = (long)local_12c.smallend.vect[1];
        lVar3 = local_110.nstride * (long)comp * 8 +
                (lVar2 - local_110.begin.y) * local_110.jstride * 8 +
                (lVar1 - local_110.begin.z) * local_110.kstride * 8 +
                (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8 +
                (long)local_110.p;
        lVar7 = (lVar2 - local_d0.begin.y) * local_d0.jstride * 4 +
                (lVar1 - local_d0.begin.z) * local_d0.kstride * 4 +
                (long)local_12c.smallend.vect[0] * 4 + (long)local_d0.begin.x * -4 +
                (long)local_d0.p;
        do {
          lVar4 = lVar2;
          lVar6 = lVar3;
          lVar8 = lVar7;
          if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
            do {
              if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                lVar5 = 0;
                dVar9 = local_170;
                do {
                  local_170 = dVar9;
                  if ((*(int *)(lVar8 + lVar5 * 4) != 0) &&
                     (local_170 = ABS(*(double *)(lVar6 + lVar5 * 8)), local_170 <= dVar9)) {
                    local_170 = dVar9;
                  }
                  lVar5 = lVar5 + 1;
                  dVar9 = local_170;
                } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar5);
              }
              lVar4 = lVar4 + 1;
              lVar6 = lVar6 + local_110.jstride * 8;
              lVar8 = lVar8 + local_d0.jstride * 4;
            } while (local_12c.bigend.vect[1] + 1 != (int)lVar4);
          }
          lVar1 = lVar1 + 1;
          lVar3 = lVar3 + local_110.kstride * 8;
          lVar7 = lVar7 + local_d0.kstride * 4;
        } while (local_12c.bigend.vect[2] + 1 != (int)lVar1);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return local_170;
}

Assistant:

Real
MultiFab::norm0 (const iMultiFab& mask, int comp, int nghost, bool local) const
{
    BL_PROFILE("MultiFab::norm0(mask)");

    Real nm0 = Real(0.0);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        auto const& maskma = mask.const_arrays();
        nm0 = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{}, *this, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            if (maskma[box_no](i,j,k)) {
                return amrex::Math::abs(ma[box_no](i,j,k,comp));
            } else {
                return Real(0.0);
            }
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:nm0)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
            Box const& bx = mfi.growntilebox(nghost);
            auto const& a = this->const_array(mfi);
            auto const& mskfab = mask.const_array(mfi);
            AMREX_LOOP_3D(bx, i, j, k,
            {
                if (mskfab(i,j,k)) {
                    nm0 = std::max(nm0, amrex::Math::abs(a(i,j,k,comp)));
                }
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Max(nm0, ParallelContext::CommunicatorSub());
    }

    return nm0;
}